

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffuptf(fitsfile *fptr,int *status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long rownum;
  long lVar7;
  long lVar8;
  LONGLONG naxis2;
  LONGLONG length;
  long tflds;
  LONGLONG addr;
  char newform [71];
  char tform [71];
  char comment [73];
  char keyname [75];
  char lenval [40];
  char message [81];
  char card [81];
  double local_290;
  long local_280;
  fitsfile *local_278;
  long local_270;
  long local_268;
  LONGLONG local_260;
  undefined2 local_258 [40];
  byte local_208;
  byte local_207;
  char local_1b8 [80];
  char local_168 [80];
  char local_118 [48];
  char local_e8 [96];
  char local_88 [88];
  
  ffmaky(fptr,2,status);
  ffgkyjj(fptr,"NAXIS2",&local_280,local_1b8,status);
  ffgkyj(fptr,"TFIELDS",&local_268,local_1b8,status);
  if (0 < local_268) {
    lVar8 = 1;
    local_278 = fptr;
    do {
      ffkeyn("TFORM",(int)lVar8,local_168,status);
      iVar2 = ffgkys(fptr,local_168,(char *)&local_208,local_1b8,status);
      if (0 < iVar2) {
        memcpy(local_e8,"Error while updating variable length vector TFORMn values (ffuptf).",0x44);
        ffxmsg(5,local_e8);
        break;
      }
      if (((local_208 & 0xfe) == 0x50) || ((local_207 & 0xfe) == 0x50)) {
        if (local_280 < 1) {
          local_290 = 0.0;
        }
        else {
          rownum = 0;
          lVar7 = 0;
          do {
            rownum = rownum + 1;
            ffgdesll(fptr,(int)lVar8,rownum,&local_270,&local_260,status);
            if (lVar7 < local_270) {
              lVar7 = local_270;
            }
          } while (rownum < local_280);
          local_290 = (double)lVar7;
        }
        local_258[0] = 0x27;
        pcVar3 = strchr((char *)&local_208,0x28);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '\0';
        }
        sVar4 = strlen((char *)&local_208);
        snprintf(local_118,0x28,"(%.0f)",local_290);
        sVar5 = strlen(local_118);
        if ((sVar5 + (long)(int)sVar4) - 0x45 < 0xffffffffffffffb9) {
          ffxmsg(5,"Error assembling TFORMn string (ffuptf).");
          *status = 0x105;
          return 0x105;
        }
        strcat((char *)local_258,(char *)&local_208);
        strcat((char *)local_258,local_118);
        uVar6 = strlen((char *)local_258);
        while (uVar6 < 9) {
          sVar4 = strlen((char *)local_258);
          *(undefined2 *)((long)local_258 + sVar4) = 0x20;
          uVar6 = strlen((char *)local_258);
        }
        sVar4 = strlen((char *)local_258);
        *(undefined2 *)((long)local_258 + sVar4) = 0x27;
        ffmkky(local_168,(char *)local_258,local_1b8,local_88,status);
        fptr = local_278;
        ffmkey(local_278,local_88,status);
      }
      bVar1 = lVar8 < local_268;
      lVar8 = lVar8 + 1;
    } while (bVar1);
  }
  return *status;
}

Assistant:

int ffuptf(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  Update the value of the TFORM keywords for the variable length array
  columns to make sure they all have the form 1Px(len) or Px(len) where
  'len' is the maximum length of the vector in the table (e.g., '1PE(400)')
*/
{
    int ii, lenform=0;
    long tflds;
    LONGLONG length, addr, maxlen, naxis2, jj;
    char comment[FLEN_COMMENT], keyname[FLEN_KEYWORD];
    char tform[FLEN_VALUE], newform[FLEN_VALUE], lenval[40];
    char card[FLEN_CARD];
    char message[FLEN_ERRMSG];
    char *tmp;

    ffmaky(fptr, 2, status);         /* reset to beginning of header */
    ffgkyjj(fptr, "NAXIS2", &naxis2, comment, status);
    ffgkyj(fptr, "TFIELDS", &tflds, comment, status);

    for (ii = 1; ii <= tflds; ii++)        /* loop over all the columns */
    {
      ffkeyn("TFORM", ii, keyname, status);          /* construct name */
      if (ffgkys(fptr, keyname, tform, comment, status) > 0)
      {
        snprintf(message,FLEN_ERRMSG,
        "Error while updating variable length vector TFORMn values (ffuptf).");
        ffpmsg(message);
        return(*status);
      }
      /* is this a variable array length column ? */
      if (tform[0] == 'P' || tform[1] == 'P' || tform[0] == 'Q' || tform[1] == 'Q')
      {
          /* get the max length */
          maxlen = 0;
          for (jj=1; jj <= naxis2; jj++)
          {
            ffgdesll(fptr, ii, jj, &length, &addr, status);

	    if (length > maxlen)
	         maxlen = length;
          }

          /* construct the new keyword value */
          strcpy(newform, "'");
          tmp = strchr(tform, '(');  /* truncate old length, if present */
          if (tmp) *tmp = 0;
          lenform = strlen(tform);

          /* print as double, because the string-to-64-bit */
          /* conversion is platform dependent (%lld, %ld, %I64d) */

          snprintf(lenval,40, "(%.0f)", (double) maxlen);
          
          if (lenform+strlen(lenval)+2 > FLEN_VALUE-1)
          {
             ffpmsg("Error assembling TFORMn string (ffuptf).");
             return(*status = BAD_TFORM);
          }
          strcat(newform, tform);

          strcat(newform,lenval);
          while(strlen(newform) < 9)
             strcat(newform," ");   /* append spaces 'till length = 8 */
          strcat(newform,"'" );     /* append closing parenthesis */
          /* would be simpler to just call ffmkyj here, but this */
          /* would force linking in all the modkey & putkey routines */
          ffmkky(keyname, newform, comment, card, status);  /* make new card */
          ffmkey(fptr, card, status);   /* replace last read keyword */
      }
    }
    return(*status);
}